

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::EntryPointInfo::InstallGuards(EntryPointInfo *this,ScriptContext *scriptContext)

{
  Type *pTVar1;
  Type ppJVar2;
  Type *addr;
  PropertyId PVar3;
  uint uVar4;
  uint sourceContextId;
  uint uVar5;
  JitTransferData *pJVar6;
  ThreadContext *pTVar7;
  Type ppCVar8;
  ulong uVar9;
  code *pcVar10;
  Type TVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  NativeEntryPointData *this_00;
  NativeEntryPointData *pNVar17;
  undefined4 *puVar18;
  Type piVar19;
  EquivalentTypeCache *pEVar20;
  ulong uVar21;
  Type *pTVar22;
  FakePropertyGuardWeakReference *pFVar23;
  JitPolyEquivalentTypeGuard *this_01;
  CtorCacheTransferEntryIDL *pCVar24;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar25;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  PropertyRecord *pPVar26;
  CtorCacheGuardTransferEntry this_02;
  EquivalentTypeCache *pEVar27;
  TypeGuardTransferEntry this_03;
  ulong uVar28;
  EquivalentTypeCache *pEVar29;
  EquivalentTypeCache *pEVar30;
  uint8 i;
  CtorCacheTransferEntryIDL **entries;
  long lVar31;
  Type pCVar32;
  Type pTVar33;
  JitEquivalentTypeGuard **guard;
  Type ppJVar34;
  bool bVar35;
  byte bVar36;
  PropertyGuard *local_498;
  WCHAR prefixValue [512];
  Type local_38;
  PropertyGuard *sharedPropertyGuard;
  
  bVar36 = 0;
  this_00 = GetNativeEntryPointData(this);
  pNVar17 = GetNativeEntryPointData(this);
  pJVar6 = (pNVar17->jitTransferData).ptr;
  if ((pJVar6 == (JitTransferData *)0x0) || (pJVar6->isReady == false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0x20de,
                                 "(jitTransferData != nullptr && jitTransferData->GetIsReady())",
                                 "jitTransferData != nullptr && jitTransferData->GetIsReady()");
    if (!bVar12) goto LAB_00772c11;
    *puVar18 = 0;
  }
  if (0 < pJVar6->lazyBailoutPropertyCount) {
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lVar31 = 0;
    do {
      piVar19 = pJVar6->lazyBailoutProperties;
      if (piVar19 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar18 = 1;
        bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                     ,0x20e2,"(jitTransferData->lazyBailoutProperties != nullptr)",
                                     "jitTransferData->lazyBailoutProperties != nullptr");
        if (!bVar12) goto LAB_00772c11;
        *puVar18 = 0;
        piVar19 = pJVar6->lazyBailoutProperties;
      }
      PVar3 = piVar19[lVar31];
      local_38.ptr = (FakePropertyGuardWeakReference *)0x0;
      bVar12 = NativeEntryPointData::TryGetSharedPropertyGuard
                         (this_00,PVar3,(PropertyGuard **)&local_38);
      if (!bVar12) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar18 = 1;
        bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                     ,0x20e7,"(hasSharedPropertyGuard)","hasSharedPropertyGuard");
        if (!bVar12) goto LAB_00772c11;
        *puVar18 = 0;
LAB_00772aeb:
        bVar12 = Phases::IsEnabled((Phases *)&DAT_015b6718,LazyBailoutPhase);
        if (bVar12) {
          iVar16 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          uVar25 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar16) + 0x38))
                             ((long *)CONCAT44(extraout_var_01,iVar16));
          iVar16 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          uVar4 = *(uint *)**(undefined8 **)
                             (*(long *)(CONCAT44(extraout_var_02,iVar16) + 0x20) + 0x70);
          iVar16 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          lVar31 = *(long *)(CONCAT44(extraout_var_03,iVar16) + 0x10);
          if (lVar31 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar18 = 1;
            bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
            if (!bVar12) goto LAB_00772c11;
            *puVar18 = 0;
            lVar31 = *(long *)(CONCAT44(extraout_var_03,iVar16) + 0x10);
          }
          uVar5 = *(uint *)(lVar31 + 0x10);
          iVar16 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          swprintf_s<512ul>((WCHAR (*) [512])&local_498,L"Function %s (#%d.%u, #%u)",uVar25,
                            (ulong)uVar4,(ulong)uVar5,
                            (ulong)*(uint *)(CONCAT44(extraout_var_04,iVar16) + 0x40));
          pPVar26 = ScriptContext::GetPropertyName(scriptContext,PVar3);
          Output::TraceWithPrefix
                    (LazyBailoutPhase,(char16 *)&local_498,
                     L"Lazy bailout - Invalidation due to property: %s \n",pPVar26 + 1);
        }
        (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xd])(this,1);
        return;
      }
      if (((ulong)((local_38.ptr)->super_RecyclerWeakReference<Js::PropertyGuard>).
                  super_RecyclerWeakReferenceBase.strongRef & 0xfffffffffffffffd) == 0)
      goto LAB_00772aeb;
      ThreadContext::RegisterLazyBailout(scriptContext->threadContext,PVar3,this);
      lVar31 = lVar31 + 1;
    } while (lVar31 < pJVar6->lazyBailoutPropertyCount);
  }
  if (0 < pJVar6->equivalentTypeGuardCount) {
    if (pJVar6->equivalentTypeGuardOffsets != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar18 = 1;
      bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0x20f9,
                                   "(jitTransferData->equivalentTypeGuardOffsets == nullptr)",
                                   "jitTransferData->equivalentTypeGuardOffsets == nullptr");
      if (!bVar12) goto LAB_00772c11;
      *puVar18 = 0;
    }
    ppJVar34 = pJVar6->equivalentTypeGuards;
    if (ppJVar34 == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar18 = 1;
      bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0x20fa,"(jitTransferData->equivalentTypeGuards != nullptr)",
                                   "jitTransferData->equivalentTypeGuards != nullptr");
      if (!bVar12) goto LAB_00772c11;
      *puVar18 = 0;
      ppJVar34 = pJVar6->equivalentTypeGuards;
    }
    iVar16 = pJVar6->equivalentTypeGuardCount;
    pEVar20 = NativeEntryPointData::EnsureEquivalentTypeCache(this_00,iVar16,scriptContext,this);
    ppJVar2 = ppJVar34 + iVar16;
    if (ppJVar34 < ppJVar2) {
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_0077254f:
      pEVar27 = (*ppJVar34)->cache;
      pEVar29 = pEVar27;
      pEVar30 = pEVar20;
      for (lVar31 = 0xb; lVar31 != 0; lVar31 = lVar31 + -1) {
        pEVar30->types[0] = pEVar29->types[0];
        pEVar29 = (EquivalentTypeCache *)((long)pEVar29 + (ulong)bVar36 * -0x10 + 8);
        pEVar30 = (EquivalentTypeCache *)((long)pEVar30 + (ulong)bVar36 * -0x10 + 8);
      }
      bVar12 = pEVar27->hasFixedValue;
      pEVar20->isLoadedFromProto = pEVar27->isLoadedFromProto;
      pEVar20->hasFixedValue = bVar12;
      pEVar20->nextEvictionVictim = pEVar27->nextEvictionVictim;
      (*ppJVar34)->cache = pEVar20;
      lVar31 = 8;
      uVar21 = 0;
      pEVar27 = pEVar20;
      do {
        if (pEVar20->types[uVar21] == (Type *)0x0) {
          if (uVar21 < 8) goto LAB_007725ac;
          break;
        }
        pTVar1 = &pEVar20->types[uVar21]->flags;
        *pTVar1 = *pTVar1 | TypeFlagMask_HasBeenCached;
        uVar21 = uVar21 + 1;
        pEVar27 = (EquivalentTypeCache *)(pEVar27->types + 1);
        lVar31 = lVar31 + -1;
      } while (uVar21 != 8);
      goto LAB_007725fe;
    }
  }
LAB_00772610:
  if (pJVar6->propertyGuardsByPropertyId != (Type)0x0) {
    iVar16 = pJVar6->propertyGuardCount;
    pTVar22 = NativeEntryPointData::EnsurePropertyGuardWeakRefs
                        (this_00,iVar16,scriptContext->recycler);
    pTVar33 = pJVar6->propertyGuardsByPropertyId;
    PVar3 = pTVar33->propertyId;
    if (PVar3 != -1) {
      pTVar7 = scriptContext->threadContext;
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        local_498 = (PropertyGuard *)0x0;
        bVar12 = NativeEntryPointData::TryGetSharedPropertyGuard(this_00,PVar3,&local_498);
        if (bVar12) {
          bVar35 = (local_498->value & 0xfffffffffffffffdU) != 0;
        }
        else {
          bVar35 = false;
        }
        this_03 = pTVar33[1];
        if (this_03 == (TypeGuardTransferEntry)0x0) {
          lVar31 = 1;
        }
        else {
          iVar15 = 0;
          do {
            iVar14 = iVar15;
            if (bVar12) {
              lVar31 = (long)*(int *)((long)this_03 + 0xc);
              if ((lVar31 < 0) || (iVar16 <= *(int *)((long)this_03 + 0xc))) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar18 = 1;
                bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                             ,0x2187,
                                             "(guardIndex >= 0 && guardIndex < propertyGuardCount)",
                                             "guardIndex >= 0 && guardIndex < propertyGuardCount");
                if (!bVar13) goto LAB_00772c11;
                *puVar18 = 0;
              }
              if (bVar35) {
                pFVar23 = pTVar22[lVar31].ptr;
                Memory::Recycler::WBSetBit((char *)&local_38);
                local_38.ptr = pFVar23;
                Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
                if (local_38.ptr == (FakePropertyGuardWeakReference *)0x0) {
                  addr = pTVar22 + lVar31;
                  pFVar23 = FakePropertyGuardWeakReference::New
                                      (scriptContext->recycler,(PropertyGuard *)this_03);
                  Memory::Recycler::WBSetBit((char *)&local_38);
                  local_38.ptr = pFVar23;
                  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
                  TVar11.ptr = local_38.ptr;
                  Memory::Recycler::WBSetBit((char *)addr);
                  addr->ptr = TVar11.ptr;
                  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
                }
                if ((TypeGuardTransferEntry)
                    ((local_38.ptr)->super_RecyclerWeakReference<Js::PropertyGuard>).
                    super_RecyclerWeakReferenceBase.strongRef != this_03) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar18 = 1;
                  bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                               ,0x2192,"(propertyGuardWeakRef->Get() == guard)",
                                               "propertyGuardWeakRef->Get() == guard");
                  if (!bVar13) goto LAB_00772c11;
                  *puVar18 = 0;
                }
                ThreadContext::RegisterUniquePropertyGuard
                          (pTVar7,PVar3,
                           &(local_38.ptr)->super_RecyclerWeakReference<Js::PropertyGuard>);
              }
              else {
                *(undefined8 *)this_03 = 0;
                if (*(char *)((long)this_03 + 8) == '\x01') {
                  this_01 = PropertyGuard::AsPolyTypeCheckGuard((PropertyGuard *)this_03);
                  i = '\0';
                  do {
                    JitPolyEquivalentTypeGuard::Invalidate(this_01,i);
                    i = i + '\x01';
                  } while (i != '\b');
                }
              }
            }
            iVar15 = iVar14 + 1;
            this_03 = pTVar33[(long)iVar15 + 1];
          } while (this_03 != (TypeGuardTransferEntry)0x0);
          lVar31 = (long)(iVar14 + 2);
        }
        pTVar33 = pTVar33 + lVar31 + 1;
        PVar3 = pTVar33->propertyId;
      } while (PVar3 != -1);
    }
  }
  ppCVar8 = (pJVar6->ctorCacheTransferData).entries;
  if ((ppCVar8 != (Type)0x0) && ((pJVar6->ctorCacheTransferData).ctorCachesCount != 0)) {
    pTVar7 = scriptContext->threadContext;
    uVar21 = 0;
    do {
      uVar4 = ppCVar8[uVar21]->propId;
      local_498 = (PropertyGuard *)0x0;
      bVar12 = NativeEntryPointData::TryGetSharedPropertyGuard(this_00,uVar4,&local_498);
      if ((bVar12) && (pCVar24 = ppCVar8[uVar21], pCVar24->cacheCount != 0)) {
        uVar9 = local_498->value;
        uVar28 = 0;
        do {
          if ((uVar9 & 0xfffffffffffffffd) == 0) {
            ConstructorCache::InvalidateAsGuard((ConstructorCache *)pCVar24[uVar28 + 1]);
          }
          else {
            ThreadContext::RegisterConstructorCache
                      (pTVar7,uVar4,(ConstructorCache *)pCVar24[uVar28 + 1]);
          }
          uVar28 = uVar28 + 1;
          pCVar24 = ppCVar8[uVar21];
        } while (uVar28 < pCVar24->cacheCount);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (pJVar6->ctorCacheTransferData).ctorCachesCount);
  }
  pCVar32 = pJVar6->ctorCacheGuardsByPropertyId;
  if ((pCVar32 != (Type)0x0) && (iVar16 = pCVar32->propertyId, iVar16 != -1)) {
    pTVar7 = scriptContext->threadContext;
    do {
      local_498 = (PropertyGuard *)0x0;
      bVar12 = NativeEntryPointData::TryGetSharedPropertyGuard(this_00,iVar16,&local_498);
      if (bVar12) {
        bVar35 = (local_498->value & 0xfffffffffffffffdU) != 0;
      }
      else {
        bVar35 = false;
      }
      this_02 = pCVar32[1];
      if (this_02 == (CtorCacheGuardTransferEntry)0x0) {
        lVar31 = 1;
      }
      else {
        iVar15 = 1;
        do {
          if (bVar12) {
            if (bVar35) {
              ThreadContext::RegisterConstructorCache(pTVar7,iVar16,(ConstructorCache *)this_02);
            }
            else {
              ConstructorCache::InvalidateAsGuard((ConstructorCache *)this_02);
            }
          }
          this_02 = pCVar32[(long)iVar15 + 1];
          iVar15 = iVar15 + 1;
        } while (this_02 != (CtorCacheGuardTransferEntry)0x0);
        lVar31 = (long)iVar15;
      }
      pCVar32 = pCVar32 + lVar31 + 1;
      iVar16 = pCVar32->propertyId;
    } while (iVar16 != -1);
  }
  iVar16 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
  sourceContextId =
       *(uint *)**(undefined8 **)(*(long *)(CONCAT44(extraout_var,iVar16) + 0x20) + 0x70);
  iVar16 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
  lVar31 = *(long *)(CONCAT44(extraout_var_00,iVar16) + 0x10);
  if (lVar31 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) {
LAB_00772c11:
      pcVar10 = (code *)invalidInstructionException();
      (*pcVar10)();
    }
    *puVar18 = 0;
    lVar31 = *(long *)(CONCAT44(extraout_var_00,iVar16) + 0x10);
  }
  bVar12 = Phases::IsEnabled((Phases *)&DAT_015aabd0,FailNativeCodeInstallPhase,sourceContextId,
                             *(LocalFunctionId *)(lVar31 + 0x10));
  if (!bVar12) {
    return;
  }
  Throw::OutOfMemory();
LAB_007725ac:
  do {
    if (pEVar27->types[0] != (Type *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar18 = 1;
      bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0x2115,"((*cache).types[__i] == nullptr)",
                                   "(*cache).types[__i] == nullptr");
      if (!bVar12) goto LAB_00772c11;
      *puVar18 = 0;
    }
    pEVar27 = (EquivalentTypeCache *)(pEVar27->types + 1);
    lVar31 = lVar31 + -1;
  } while (lVar31 != 0);
LAB_007725fe:
  pEVar20 = pEVar20 + 1;
  ppJVar34 = ppJVar34 + 1;
  if (ppJVar2 <= ppJVar34) goto LAB_00772610;
  goto LAB_0077254f;
}

Assistant:

void EntryPointInfo::InstallGuards(ScriptContext* scriptContext)
    {
        NativeEntryPointData * nativeEntryPointData = this->GetNativeEntryPointData();
        JitTransferData * jitTransferData = this->GetNativeEntryPointData()->GetJitTransferData();
        Assert(jitTransferData != nullptr && jitTransferData->GetIsReady());

        for (int i = 0; i < jitTransferData->lazyBailoutPropertyCount; i++)
        {
            Assert(jitTransferData->lazyBailoutProperties != nullptr);

            Js::PropertyId propertyId = jitTransferData->lazyBailoutProperties[i];
            Js::PropertyGuard* sharedPropertyGuard = nullptr;
            bool hasSharedPropertyGuard = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
            Assert(hasSharedPropertyGuard);
            bool isValid = hasSharedPropertyGuard && sharedPropertyGuard->IsValid();
            if (isValid)
            {
                scriptContext->GetThreadContext()->RegisterLazyBailout(propertyId, this);
            }
            else
            {
                OUTPUT_TRACE2(Js::LazyBailoutPhase, this->GetFunctionBody(), _u("Lazy bailout - Invalidation due to property: %s \n"), scriptContext->GetPropertyName(propertyId)->GetBuffer());
                this->Invalidate(true);
                return;
            }
        }


        // in-proc JIT
        if (jitTransferData->equivalentTypeGuardCount > 0)
        {
            Assert(jitTransferData->equivalentTypeGuardOffsets == nullptr);
            Assert(jitTransferData->equivalentTypeGuards != nullptr);

            int guardCount = jitTransferData->equivalentTypeGuardCount;
            JitEquivalentTypeGuard** guards = jitTransferData->equivalentTypeGuards;

            EquivalentTypeCache * cache = nativeEntryPointData->EnsureEquivalentTypeCache(guardCount, scriptContext, this);

            for (JitEquivalentTypeGuard** guard = guards; guard < guards + guardCount; guard++)
            {
                EquivalentTypeCache* oldCache = (*guard)->GetCache();
                // Copy the contents of the heap-allocated cache to the recycler-allocated version to make sure the types are
                // kept alive. Allow the properties pointer to refer to the heap-allocated arrays. It will stay alive as long
                // as the entry point is alive, and property entries contain no pointers to other recycler allocated objects.
                (*cache) = (*oldCache);
                // Set the recycler-allocated cache on the (heap-allocated) guard.
                (*guard)->SetCache(cache);

                for (uint i = 0; i < EQUIVALENT_TYPE_CACHE_SIZE; i++)
                {
                    if((*cache).types[i] != nullptr)
                    {
                        (*cache).types[i]->SetHasBeenCached();
                    }
                    else
                    {
#ifdef DEBUG
                        for (uint __i = i; __i < EQUIVALENT_TYPE_CACHE_SIZE; __i++)
                        { Assert((*cache).types[__i] == nullptr); }
#endif
                        break; // type array must be shrinked.
                    }
                }
                cache++;
            }
        }

#if ENABLE_OOP_NATIVE_CODEGEN
        if (jitTransferData->equivalentTypeGuardOffsets)
        {
            // InstallGuards
            int guardCount = jitTransferData->equivalentTypeGuardOffsets->count;
            EquivalentTypeCache* cache = this->nativeEntryPointData->EnsureEquivalentTypeCache(guardCount, scriptContext, this);
            char * nativeDataBuffer = this->GetOOPNativeEntryPointData()->GetNativeDataBuffer();
            for (int i = 0; i < guardCount; i++)
            {
                auto& cacheIDL = jitTransferData->equivalentTypeGuardOffsets->guards[i].cache;
                auto guardOffset = jitTransferData->equivalentTypeGuardOffsets->guards[i].offset;
                JitEquivalentTypeGuard* guard = (JitEquivalentTypeGuard*)(nativeDataBuffer + guardOffset);
                cache[i].guard = guard;
                cache[i].hasFixedValue = cacheIDL.hasFixedValue != 0;
                cache[i].isLoadedFromProto = cacheIDL.isLoadedFromProto != 0;
                cache[i].nextEvictionVictim = cacheIDL.nextEvictionVictim;
                cache[i].record.propertyCount = cacheIDL.record.propertyCount;
                cache[i].record.properties = (EquivalentPropertyEntry*)(nativeDataBuffer + cacheIDL.record.propertyOffset);
                for (int j = 0; j < EQUIVALENT_TYPE_CACHE_SIZE; j++)
                {
                    cache[i].types[j] = (Js::Type*)cacheIDL.types[j];
                }
                guard->SetCache(&cache[i]);
            }
        }

        // OOP JIT
        if (jitTransferData->typeGuardTransferData.entries != nullptr)
        {
            int propertyGuardCount = jitTransferData->typeGuardTransferData.propertyGuardCount;
            Field(FakePropertyGuardWeakReference*) * propertyGuardWeakRefs = this->nativeEntryPointData->EnsurePropertyGuardWeakRefs(propertyGuardCount, scriptContext->GetRecycler());
            ThreadContext* threadContext = scriptContext->GetThreadContext();
            auto next = &jitTransferData->typeGuardTransferData.entries;
            while (*next)
            {
                Js::PropertyId propertyId = (*next)->propId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                if (isNeeded)
                {
                    char * nativeDataBuffer = this->GetOOPNativeEntryPointData()->GetNativeDataBuffer();
                    for (unsigned int i = 0; i < (*next)->guardsCount; i++)
                    {
                        Js::JitIndexedPropertyGuard* guard = (Js::JitIndexedPropertyGuard*)(nativeDataBuffer + (*next)->guardOffsets[i]);
                        int guardIndex = guard->GetIndex();
                        Assert(guardIndex >= 0 && guardIndex < propertyGuardCount);
                        // We use the shared guard here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the guard here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            auto propertyGuardWeakRef = propertyGuardWeakRefs[guardIndex];
                            if (propertyGuardWeakRef == nullptr)
                            {
                                propertyGuardWeakRef = Js::FakePropertyGuardWeakReference::New(scriptContext->GetRecycler(), guard);
                                propertyGuardWeakRefs[guardIndex] = propertyGuardWeakRef;
                            }
                            Assert(propertyGuardWeakRef->Get() == guard);
                            threadContext->RegisterUniquePropertyGuard(propertyId, propertyGuardWeakRef);
                        }
                        else
                        {
                            guard->Invalidate();
                        }
                    }
                }
                *next = (*next)->next;
            }
        }
#endif

        // in-proc JIT
        // The propertyGuardsByPropertyId structure is temporary and serves only to register the type guards for the correct
        // properties.  If we've done code gen for this EntryPointInfo, typePropertyGuardsByPropertyId will have been used and nulled out.
        if (jitTransferData->propertyGuardsByPropertyId != nullptr)
        {
            int propertyGuardCount = jitTransferData->propertyGuardCount;
            Field(FakePropertyGuardWeakReference*) * propertyGuardWeakRefs = nativeEntryPointData->EnsurePropertyGuardWeakRefs(propertyGuardCount, scriptContext->GetRecycler());

            ThreadContext* threadContext = scriptContext->GetThreadContext();

            Js::TypeGuardTransferEntry* entry = jitTransferData->propertyGuardsByPropertyId;
            while (entry->propertyId != Js::Constants::NoProperty)
            {
                Js::PropertyId propertyId = entry->propertyId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                int entryGuardIndex = 0;
                while (entry->guards[entryGuardIndex] != nullptr)
                {
                    if (isNeeded)
                    {
                        Js::JitIndexedPropertyGuard* guard = entry->guards[entryGuardIndex];
                        int guardIndex = guard->GetIndex();
                        Assert(guardIndex >= 0 && guardIndex < propertyGuardCount);
                        // We use the shared guard here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the guard here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            auto propertyGuardWeakRef = propertyGuardWeakRefs[guardIndex];
                            if (propertyGuardWeakRef == nullptr)
                            {
                                propertyGuardWeakRef = Js::FakePropertyGuardWeakReference::New(scriptContext->GetRecycler(), guard);
                                propertyGuardWeakRefs[guardIndex] = propertyGuardWeakRef;
                            }
                            Assert(propertyGuardWeakRef->Get() == guard);
                            threadContext->RegisterUniquePropertyGuard(propertyId, propertyGuardWeakRef);
                        }
                        else
                        {
                            guard->Invalidate();
                        }
                    }
                    entryGuardIndex++;
                }
                entry = reinterpret_cast<Js::TypeGuardTransferEntry*>(&entry->guards[++entryGuardIndex]);
            }
        }


        // The ctorCacheGuardsByPropertyId structure is temporary and serves only to register the constructor cache guards for the correct
        // properties.  If we've done code gen for this EntryPointInfo, ctorCacheGuardsByPropertyId will have been used and nulled out.
        // Unlike type property guards, constructor cache guards use the live constructor caches associated with function objects. These are
        // recycler allocated and are kept alive by the constructorCaches field, where they were inserted during work item creation.

        // OOP JIT
        if (jitTransferData->ctorCacheTransferData.entries != nullptr)
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();

            CtorCacheTransferEntryIDL ** entries = jitTransferData->ctorCacheTransferData.entries;
            for (uint i = 0; i < jitTransferData->ctorCacheTransferData.ctorCachesCount; ++i)
            {
                Js::PropertyId propertyId = entries[i]->propId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;

                if (isNeeded)
                {
                    for (uint j = 0; j < entries[i]->cacheCount; ++j)
                    {
                        Js::ConstructorCache* cache = (Js::ConstructorCache*)(entries[i]->caches[j]);
                        // We use the shared cache here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the cache here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            threadContext->RegisterConstructorCache(propertyId, cache);
                        }
                        else
                        {
                            cache->InvalidateAsGuard();
                        }
                    }
                }
            }
        }

        if (jitTransferData->ctorCacheGuardsByPropertyId != nullptr)
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();

            Js::CtorCacheGuardTransferEntry* entry = jitTransferData->ctorCacheGuardsByPropertyId;
            while (entry->propertyId != Js::Constants::NoProperty)
            {
                Js::PropertyId propertyId = entry->propertyId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                int entryCacheIndex = 0;
                while (entry->caches[entryCacheIndex] != 0)
                {
                    if (isNeeded)
                    {
                        Js::ConstructorCache* cache = (Js::ConstructorCache*)(entry->caches[entryCacheIndex]);
                        // We use the shared cache here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the cache here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            threadContext->RegisterConstructorCache(propertyId, cache);
                        }
                        else
                        {
                            cache->InvalidateAsGuard();
                        }
                    }
                    entryCacheIndex++;
                }
                entry = reinterpret_cast<Js::CtorCacheGuardTransferEntry*>(&entry->caches[++entryCacheIndex]);
            }
        }

        if (PHASE_ON(Js::FailNativeCodeInstallPhase, this->GetFunctionBody()))
        {
            Js::Throw::OutOfMemory();
        }
    }